

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O1

Offset __thiscall
wabt::interp::Istream::Trace(Istream *this,Stream *stream,Offset offset,TraceSource *source)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  char *pcVar3;
  Instr instr;
  undefined8 uVar4;
  undefined8 uVar5;
  Instr local_d0;
  float local_b4;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [32];
  undefined1 *local_80;
  Offset local_74;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_74 = offset;
  Read(&local_d0,this,&local_74);
  (*source->_vptr_TraceSource[2])(local_70,source,(ulong)offset);
  puVar1 = local_70[0];
  Opcode::GetInfo(&local_d0.op);
  Stream::Writef(stream,"%s| %s",puVar1,local_b0[0]);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  switch(local_d0.kind) {
  case Imm_0_Op_0:
    Stream::Writef(stream,"\n");
    break;
  case Imm_0_Op_1:
    (*source->_vptr_TraceSource[3])(local_b0,source,1);
    Stream::Writef(stream," %s\n",local_b0[0]);
    goto LAB_0019c39e;
  case Imm_0_Op_2:
    (*source->_vptr_TraceSource[3])(local_b0,source,2);
    puVar1 = local_b0[0];
    (*source->_vptr_TraceSource[3])(local_70,source,1);
    Stream::Writef(stream," %s, %s\n",puVar1,local_70[0]);
    goto LAB_0019c38b;
  case Imm_0_Op_3:
    (*source->_vptr_TraceSource[3])(local_b0,source,3);
    puVar1 = local_b0[0];
    (*source->_vptr_TraceSource[3])(local_70,source,2);
    puVar2 = local_70[0];
    (*source->_vptr_TraceSource[3])(local_50,source,1);
    Stream::Writef(stream," %s, %s, %s\n",puVar1,puVar2,local_50[0]);
    goto LAB_0019c2a8;
  case Imm_Jump_Op_0:
    pcVar3 = " @%u\n";
    goto LAB_0019bd87;
  case Imm_Jump_Op_1:
    (*source->_vptr_TraceSource[3])(local_b0,source,1);
    pcVar3 = " @%u, %s\n";
    goto LAB_0019c2fb;
  case Imm_Index_Op_0:
  case Imm_Index_Op_N:
    pcVar3 = " $%u\n";
    goto LAB_0019bd87;
  case Imm_Index_Op_1:
    (*source->_vptr_TraceSource[3])(local_b0,source,1);
    pcVar3 = " $%u, %s\n";
LAB_0019c2fb:
    Stream::Writef(stream,pcVar3,(ulong)local_d0.field_2.imm_u32,local_b0[0]);
    goto LAB_0019c39e;
  case Imm_Index_Op_2:
    (*source->_vptr_TraceSource[3])(local_b0,source,2);
    puVar1 = local_b0[0];
    (*source->_vptr_TraceSource[3])(local_70,source,1);
    Stream::Writef(stream," $%u, %s, %s\n",(ulong)local_d0.field_2.imm_u32,puVar1,local_70[0]);
    goto LAB_0019c38b;
  case Imm_Index_Op_3:
    local_b4 = (float)local_d0.field_2.imm_u32;
    (*source->_vptr_TraceSource[3])(local_b0,source,3);
    puVar1 = local_b0[0];
    (*source->_vptr_TraceSource[3])(local_70,source,2);
    puVar2 = local_70[0];
    uVar5 = CONCAT44(local_d0.field_2._12_4_,local_d0.field_2._8_4_);
    uVar4 = CONCAT44(local_d0.kind,local_d0.op.enum_);
    (*source->_vptr_TraceSource[3])(local_50,source,1);
    Stream::Writef(stream," $%u, %s, %s, %s\n",(ulong)(uint)local_b4,puVar1,puVar2,local_50[0],uVar4
                   ,local_d0.field_2.imm_u32,uVar5);
    goto LAB_0019c2a8;
  case Imm_Index_Index_Op_3:
    local_b4 = (float)local_d0.field_2.imm_u32;
    local_80 = (undefined1 *)CONCAT44(local_80._4_4_,local_d0.field_2.imm_u32x2.snd);
    (*source->_vptr_TraceSource[3])(local_b0,source,3);
    puVar1 = local_b0[0];
    (*source->_vptr_TraceSource[3])(local_70,source,2);
    puVar2 = local_70[0];
    uVar5 = CONCAT44(local_d0.field_2._12_4_,local_d0.field_2._8_4_);
    (*source->_vptr_TraceSource[3])(local_50,source,1);
    Stream::Writef(stream," $%u, $%u, %s, %s, %s\n",(ulong)(uint)local_b4,
                   (ulong)local_80 & 0xffffffff,puVar1,puVar2,local_50[0],local_d0.field_2.imm_u32,
                   uVar5);
    goto LAB_0019c2a8;
  case Imm_Index_Index_Op_N:
    pcVar3 = " $%u, $%u\n";
    goto LAB_0019c10e;
  case Imm_Index_Offset_Op_1:
    (*source->_vptr_TraceSource[3])(local_b0,source,1);
    Stream::Writef(stream," $%u:%s+$%u\n",(ulong)local_d0.field_2.imm_u32,local_b0[0],
                   (ulong)local_d0.field_2.imm_u32x2.snd);
    goto LAB_0019c39e;
  case Imm_Index_Offset_Op_2:
    local_b4 = (float)local_d0.field_2.imm_u32;
    (*source->_vptr_TraceSource[3])(local_b0,source,2);
    puVar1 = local_b0[0];
    uVar5 = CONCAT44(local_d0.field_2._12_4_,local_d0.field_2._8_4_);
    uVar4 = CONCAT44(local_d0.kind,local_d0.op.enum_);
    (*source->_vptr_TraceSource[3])(local_70,source,1);
    Stream::Writef(stream," $%u:%s+$%u, %s\n",(ulong)(uint)local_b4,puVar1,
                   (ulong)local_d0.field_2.imm_u32x2.snd,local_70[0],uVar4,local_d0.field_2.imm_u32,
                   uVar5);
    goto LAB_0019c38b;
  case Imm_Index_Offset_Op_3:
    local_b4 = (float)local_d0.field_2.imm_u32;
    (*source->_vptr_TraceSource[3])(local_b0,source,3);
    local_80 = local_b0[0];
    (*source->_vptr_TraceSource[3])(local_70,source,2);
    puVar1 = local_70[0];
    uVar5 = CONCAT44(local_d0.field_2._12_4_,local_d0.field_2._8_4_);
    (*source->_vptr_TraceSource[3])(local_50,source,1);
    Stream::Writef(stream," $%u:%s+$%u, %s, %s\n",(ulong)(uint)local_b4,local_80,
                   (ulong)local_d0.field_2.imm_u32x2.snd,puVar1,local_50[0],local_d0.field_2.imm_u32
                   ,uVar5);
LAB_0019c2a8:
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    goto LAB_0019c38b;
  case Imm_I32_Op_0:
    pcVar3 = " %u\n";
LAB_0019bd87:
    Stream::Writef(stream,pcVar3,(ulong)local_d0.field_2.imm_u32);
    break;
  case Imm_I64_Op_0:
    Stream::Writef(stream," %lu\n",CONCAT44(local_d0.field_2.imm_u32x2.snd,local_d0.field_2.imm_u32)
                  );
    break;
  case Imm_F32_Op_0:
    local_d0.field_2.imm_u32 = SUB84((double)(float)local_d0.field_2.imm_f32,0);
    goto LAB_0019c3c4;
  case Imm_F64_Op_0:
LAB_0019c3c4:
    Stream::Writef(stream," %g\n",local_d0.field_2.imm_u32);
    break;
  case Imm_I32_I32_Op_0:
    pcVar3 = " $%u $%u\n";
LAB_0019c10e:
    Stream::Writef(stream,pcVar3,(ulong)local_d0.field_2.imm_u32,
                   (ulong)local_d0.field_2.imm_u32x2.snd);
    break;
  case Imm_I8_Op_1:
    (*source->_vptr_TraceSource[3])(local_b0,source,1);
    Stream::Writef(stream," %s : (Lane imm: %u)\n",local_b0[0],(ulong)local_d0.field_2.imm_u8);
    goto LAB_0019c39e;
  case Imm_I8_Op_2:
    (*source->_vptr_TraceSource[3])(local_b0,source,2);
    puVar1 = local_b0[0];
    (*source->_vptr_TraceSource[3])(local_70,source,1);
    Stream::Writef(stream," %s, %s : (Lane imm: $%u)\n",puVar1,local_70[0],
                   (ulong)local_d0.field_2.imm_u8);
    goto LAB_0019c38b;
  case Imm_V128_Op_0:
    Stream::Writef(stream," i32x4 0x%08x 0x%08x 0x%08x 0x%08x\n",(ulong)local_d0.field_2.imm_u32,
                   (ulong)local_d0.field_2.imm_u32x2.snd,(ulong)(uint)local_d0.field_2._8_4_,
                   (ulong)(uint)local_d0.field_2._12_4_);
    break;
  case Imm_V128_Op_2:
    (*source->_vptr_TraceSource[3])(local_b0,source,2);
    puVar1 = local_b0[0];
    uVar5 = CONCAT44(local_d0.field_2._12_4_,local_d0.field_2._8_4_);
    (*source->_vptr_TraceSource[3])(local_70,source,1);
    Stream::Writef(stream," %s, %s : (Lane imm: i32x4 0x%08x 0x%08x 0x%08x 0x%08x )\n",puVar1,
                   local_70[0],(ulong)local_d0.field_2.imm_u32,(ulong)local_d0.field_2.imm_u32x2.snd
                   ,CONCAT44(local_d0.kind,local_d0.field_2._8_4_),local_d0.field_2._12_4_,uVar5);
LAB_0019c38b:
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
LAB_0019c39e:
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
  }
  return local_74;
}

Assistant:

Istream::Offset Istream::Trace(Stream* stream,
                               Offset offset,
                               TraceSource* source) const {
  Offset start = offset;
  Instr instr = Read(&offset);
  stream->Writef("%s| %s", source->Header(start).c_str(), instr.op.GetName());

  switch (instr.kind) {
    case InstrKind::Imm_0_Op_0:
      stream->Writef("\n");
      break;

    case InstrKind::Imm_0_Op_1:
      stream->Writef(" %s\n", source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_0_Op_2:
      stream->Writef(" %s, %s\n", source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_0_Op_3:
      stream->Writef(" %s, %s, %s\n", source->Pick(3, instr).c_str(),
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Jump_Op_0:
      stream->Writef(" @%u\n", instr.imm_u32);
      break;

    case InstrKind::Imm_Jump_Op_1:
      stream->Writef(" @%u, %s\n", instr.imm_u32,
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_0:
      stream->Writef(" $%u\n", instr.imm_u32);
      break;

    case InstrKind::Imm_Index_Op_1:
      stream->Writef(" $%u, %s\n", instr.imm_u32,
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_2:
      stream->Writef(" $%u, %s, %s\n", instr.imm_u32,
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_3:
      stream->Writef(
          " $%u, %s, %s, %s\n", instr.imm_u32, source->Pick(3, instr).c_str(),
          source->Pick(2, instr).c_str(), source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Op_N:
      stream->Writef(" $%u\n", instr.imm_u32); // TODO param/result count?
      break;

    case InstrKind::Imm_Index_Index_Op_3:
      stream->Writef(" $%u, $%u, %s, %s, %s\n", instr.imm_u32x2.fst,
                     instr.imm_u32x2.snd, source->Pick(3, instr).c_str(),
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Index_Op_N:
      stream->Writef(" $%u, $%u\n", instr.imm_u32x2.fst,
                     instr.imm_u32x2.snd);  // TODO param/result count?
      break;

    case InstrKind::Imm_Index_Offset_Op_1:
      stream->Writef(" $%u:%s+$%u\n", instr.imm_u32x2.fst,
                     source->Pick(1, instr).c_str(), instr.imm_u32x2.snd);
      break;

    case InstrKind::Imm_Index_Offset_Op_2:
      stream->Writef(" $%u:%s+$%u, %s\n", instr.imm_u32x2.fst,
                     source->Pick(2, instr).c_str(), instr.imm_u32x2.snd,
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_Index_Offset_Op_3:
      stream->Writef(" $%u:%s+$%u, %s, %s\n", instr.imm_u32x2.fst,
                     source->Pick(3, instr).c_str(), instr.imm_u32x2.snd,
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str());
      break;

    case InstrKind::Imm_I32_Op_0:
      stream->Writef(" %u\n", instr.imm_u32);
      break;

    case InstrKind::Imm_I64_Op_0:
      stream->Writef(" %" PRIu64 "\n", instr.imm_u64);
      break;

    case InstrKind::Imm_F32_Op_0:
      stream->Writef(" %g\n", instr.imm_f32);
      break;

    case InstrKind::Imm_F64_Op_0:
      stream->Writef(" %g\n", instr.imm_f64);
      break;

    case InstrKind::Imm_I32_I32_Op_0:
      stream->Writef(" $%u $%u\n", instr.imm_u32x2.fst, instr.imm_u32x2.snd);
      break;

    case InstrKind::Imm_I8_Op_1:
      // TODO: cleanup
      stream->Writef(" %s : (Lane imm: %u)\n", source->Pick(1, instr).c_str(),
                     instr.imm_u8);
      break;

    case InstrKind::Imm_I8_Op_2:
      // TODO: cleanup
      stream->Writef(" %s, %s : (Lane imm: $%u)\n",
                     source->Pick(2, instr).c_str(),
                     source->Pick(1, instr).c_str(), instr.imm_u8);
      break;

    case InstrKind::Imm_V128_Op_0:
      stream->Writef(" i32x4 0x%08x 0x%08x 0x%08x 0x%08x\n",
                     instr.imm_v128.u32(0), instr.imm_v128.u32(1),
                     instr.imm_v128.u32(2), instr.imm_v128.u32(3));
      break;

    case InstrKind::Imm_V128_Op_2:
      // TODO: cleanup
      stream->Writef(
          " %s, %s : (Lane imm: i32x4 0x%08x 0x%08x 0x%08x 0x%08x )\n",
          source->Pick(2, instr).c_str(), source->Pick(1, instr).c_str(),
          instr.imm_v128.u32(0), instr.imm_v128.u32(1), instr.imm_v128.u32(2),
          instr.imm_v128.u32(3));
      break;
  }
  return offset;
}